

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_initCStream_internal
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_CDict *cdict,
                 ZSTD_CCtx_params params,unsigned_long_long pledgedSrcSize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ZSTD_CCtx_params params_00;
  ZSTD_compressionParameters cParams;
  size_t sVar4;
  ZSTD_compressionParameters local_58;
  
  ZSTD_getCParamsFromCCtxParams(&local_58,&params,pledgedSrcSize,dictSize);
  params.cParams.minMatch = local_58.minMatch;
  params.cParams.targetLength = local_58.targetLength;
  params.cParams.strategy = local_58.strategy;
  params.cParams.windowLog = local_58.windowLog;
  params.cParams.chainLog = local_58.chainLog;
  params.cParams.hashLog = local_58.hashLog;
  params.cParams.searchLog = local_58.searchLog;
  if (dictSize < 8 || dict == (void *)0x0) {
    if (cdict != (ZSTD_CDict *)0x0) {
      params.cParams.windowLog = (cdict->matchState).cParams.windowLog;
      params.cParams.chainLog = (cdict->matchState).cParams.chainLog;
      uVar1 = (cdict->matchState).cParams.hashLog;
      uVar2 = (cdict->matchState).cParams.searchLog;
      uVar3 = (cdict->matchState).cParams.minMatch;
      params.cParams.targetLength = (cdict->matchState).cParams.targetLength;
      params.cParams.strategy = (cdict->matchState).cParams.strategy;
      params.cParams.hashLog = uVar1;
      params.cParams.searchLog = uVar2;
      params.cParams.minMatch = uVar3;
    }
    ZSTD_freeCDict(zcs->cdictLocal);
    zcs->cdictLocal = (ZSTD_CDict *)0x0;
    zcs->cdict = cdict;
LAB_0041526e:
    params_00.cParams.windowLog = params.cParams.windowLog;
    params_00.cParams.chainLog = params.cParams.chainLog;
    params_00.format = params.format;
    params_00.cParams.hashLog = params.cParams.hashLog;
    params_00.cParams.searchLog = params.cParams.searchLog;
    params_00.cParams.minMatch = params.cParams.minMatch;
    params_00.cParams.targetLength = params.cParams.targetLength;
    params_00.cParams.strategy = params.cParams.strategy;
    params_00.fParams = params.fParams;
    params_00.compressionLevel = params.compressionLevel;
    params_00.forceWindow = params.forceWindow;
    params_00.attachDictPref = params.attachDictPref;
    params_00.nbWorkers = params.nbWorkers;
    params_00._60_4_ = params._60_4_;
    params_00.jobSize = params.jobSize;
    params_00.overlapLog = params.overlapLog;
    params_00.rsyncable = params.rsyncable;
    params_00.ldmParams = params.ldmParams;
    params_00.customMem = params.customMem;
    sVar4 = ZSTD_resetCStream_internal
                      (zcs,(void *)0x0,0,ZSTD_dct_auto,cdict,params_00,pledgedSrcSize);
    return sVar4;
  }
  if (zcs->staticSize == 0) {
    ZSTD_freeCDict(zcs->cdictLocal);
    local_58.targetLength = params.cParams.targetLength;
    local_58.strategy = params.cParams.strategy;
    local_58.windowLog = params.cParams.windowLog;
    local_58.chainLog = params.cParams.chainLog;
    cParams.hashLog = params.cParams.hashLog;
    cParams.windowLog = params.cParams.windowLog;
    cParams.chainLog = params.cParams.chainLog;
    cParams.searchLog = params.cParams.searchLog;
    cParams.minMatch = params.cParams.minMatch;
    cParams.targetLength = params.cParams.targetLength;
    cParams.strategy = params.cParams.strategy;
    cdict = ZSTD_createCDict_advanced
                      (dict,dictSize,ZSTD_dlm_byCopy,ZSTD_dct_auto,cParams,zcs->customMem);
    zcs->cdictLocal = cdict;
    zcs->cdict = cdict;
    if (cdict != (ZSTD_CDict *)0x0) goto LAB_0041526e;
  }
  return 0xffffffffffffffc0;
}

Assistant:

size_t ZSTD_initCStream_internal(ZSTD_CStream* zcs,
                    const void* dict, size_t dictSize, const ZSTD_CDict* cdict,
                    ZSTD_CCtx_params params, unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_internal");
    params.cParams = ZSTD_getCParamsFromCCtxParams(&params, pledgedSrcSize, dictSize);
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */

    if (dict && dictSize >= 8) {
        DEBUGLOG(4, "loading dictionary of size %u", (unsigned)dictSize);
        if (zcs->staticSize) {   /* static CCtx : never uses malloc */
            /* incompatible with internal cdict creation */
            return ERROR(memory_allocation);
        }
        ZSTD_freeCDict(zcs->cdictLocal);
        zcs->cdictLocal = ZSTD_createCDict_advanced(dict, dictSize,
                                            ZSTD_dlm_byCopy, ZSTD_dct_auto,
                                            params.cParams, zcs->customMem);
        zcs->cdict = zcs->cdictLocal;
        if (zcs->cdictLocal == NULL) return ERROR(memory_allocation);
    } else {
        if (cdict) {
            params.cParams = ZSTD_getCParamsFromCDict(cdict);  /* cParams are enforced from cdict; it includes windowLog */
        }
        ZSTD_freeCDict(zcs->cdictLocal);
        zcs->cdictLocal = NULL;
        zcs->cdict = cdict;
    }

    return ZSTD_resetCStream_internal(zcs, NULL, 0, ZSTD_dct_auto, zcs->cdict, params, pledgedSrcSize);
}